

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll.c
# Opt level: O2

int insert_lock(ll_elem *n)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  
  uVar1 = 0;
  while( true ) {
    LOCK();
    uVar2 = n->succ;
    bVar3 = uVar1 == uVar2;
    if (bVar3) {
      n->succ = uVar1 | 2;
      uVar2 = uVar1;
    }
    UNLOCK();
    if (bVar3) break;
    uVar1 = uVar2;
    if (1 < uVar2) {
      return 0;
    }
  }
  do {
  } while (1 < n->pred);
  return 1;
}

Assistant:

static __inline int
insert_lock(struct ll_elem *n)
{
	uintptr_t zero = 0;

	/* Mark succ as flagged, preserving the DEREF bit. */
	while (!atomic_compare_exchange_weak_explicit(&n->succ, &zero,
	    FLAGGED | (zero & DEREF),
	    memory_order_acquire, memory_order_relaxed)) {
		if (zero & ~DEREF)
			return 0;
	}
	/* Wait for pred to fall to zero. */
	while (atomic_load_explicit(&n->pred, memory_order_relaxed) & ~DEREF)
		SPINWAIT();

	return 1;
}